

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

int xmlTextReaderRelaxNGValidateInternal
              (xmlTextReaderPtr reader,char *rng,xmlRelaxNGValidCtxtPtr ctxt,int options)

{
  xmlRelaxNGParserCtxtPtr ctxt_00;
  xmlRelaxNGPtr pxVar1;
  
  if (((reader != (xmlTextReaderPtr)0x0) &&
      (rng == (char *)0x0 || ctxt == (xmlRelaxNGValidCtxtPtr)0x0)) &&
     ((rng == (char *)0x0 && ctxt == (xmlRelaxNGValidCtxtPtr)0x0 ||
      ((reader->mode == 0 && (reader->ctxt != (xmlParserCtxtPtr)0x0)))))) {
    if (reader->rngValidCtxt != (xmlRelaxNGValidCtxtPtr)0x0) {
      if (reader->rngPreserveCtxt == 0) {
        xmlRelaxNGFreeValidCtxt(reader->rngValidCtxt);
      }
      reader->rngValidCtxt = (xmlRelaxNGValidCtxtPtr)0x0;
    }
    reader->rngPreserveCtxt = 0;
    if (reader->rngSchemas != (xmlRelaxNGPtr)0x0) {
      xmlRelaxNGFree(reader->rngSchemas);
      reader->rngSchemas = (xmlRelaxNGPtr)0x0;
    }
    if (rng == (char *)0x0 && ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
      return 0;
    }
    if (rng == (char *)0x0) {
      reader->rngValidCtxt = ctxt;
      reader->rngPreserveCtxt = 1;
LAB_00179b22:
      if ((reader->errorFunc != (xmlTextReaderErrorFunc)0x0) ||
         (reader->sErrorFunc != (xmlStructuredErrorFunc)0x0)) {
        xmlRelaxNGSetValidStructuredErrors(ctxt,xmlTextReaderStructuredRelay,reader);
      }
      reader->rngValidErrors = 0;
      reader->rngFullNode = (xmlNodePtr)0x0;
      reader->validate = XML_TEXTREADER_VALIDATE_RNG;
      return 0;
    }
    ctxt_00 = xmlRelaxNGNewParserCtxt(rng);
    if ((reader->errorFunc != (xmlTextReaderErrorFunc)0x0) ||
       (reader->sErrorFunc != (xmlStructuredErrorFunc)0x0)) {
      xmlRelaxNGSetParserStructuredErrors(ctxt_00,xmlTextReaderStructuredRelay,reader);
    }
    pxVar1 = xmlRelaxNGParse(ctxt_00);
    reader->rngSchemas = pxVar1;
    xmlRelaxNGFreeParserCtxt(ctxt_00);
    if (reader->rngSchemas != (xmlRelaxNGPtr)0x0) {
      ctxt = xmlRelaxNGNewValidCtxt(reader->rngSchemas);
      reader->rngValidCtxt = ctxt;
      if (ctxt != (xmlRelaxNGValidCtxtPtr)0x0) goto LAB_00179b22;
      xmlRelaxNGFree(reader->rngSchemas);
      reader->rngSchemas = (xmlRelaxNGPtr)0x0;
    }
  }
  return -1;
}

Assistant:

static int
xmlTextReaderRelaxNGValidateInternal(xmlTextReaderPtr reader,
				     const char *rng,
				     xmlRelaxNGValidCtxtPtr ctxt,
				     int options ATTRIBUTE_UNUSED)
{
    if (reader == NULL)
	return(-1);

    if ((rng != NULL) && (ctxt != NULL))
	return (-1);

    if (((rng != NULL) || (ctxt != NULL)) &&
	((reader->mode != XML_TEXTREADER_MODE_INITIAL) ||
	 (reader->ctxt == NULL)))
	return(-1);

    /* Cleanup previous validation stuff. */
    if (reader->rngValidCtxt != NULL) {
	if ( !reader->rngPreserveCtxt)
	    xmlRelaxNGFreeValidCtxt(reader->rngValidCtxt);
	reader->rngValidCtxt = NULL;
    }
    reader->rngPreserveCtxt = 0;
    if (reader->rngSchemas != NULL) {
	xmlRelaxNGFree(reader->rngSchemas);
	reader->rngSchemas = NULL;
    }

    if ((rng == NULL) && (ctxt == NULL)) {
	/* We just want to deactivate the validation, so get out. */
	return(0);
    }


    if (rng != NULL) {
	xmlRelaxNGParserCtxtPtr pctxt;
	/* Parse the schema and create validation environment. */

	pctxt = xmlRelaxNGNewParserCtxt(rng);
	if ((reader->errorFunc != NULL) || (reader->sErrorFunc != NULL))
	    xmlRelaxNGSetParserStructuredErrors(pctxt,
                    xmlTextReaderStructuredRelay, reader);
	reader->rngSchemas = xmlRelaxNGParse(pctxt);
	xmlRelaxNGFreeParserCtxt(pctxt);
	if (reader->rngSchemas == NULL)
	    return(-1);

	reader->rngValidCtxt = xmlRelaxNGNewValidCtxt(reader->rngSchemas);
	if (reader->rngValidCtxt == NULL) {
	    xmlRelaxNGFree(reader->rngSchemas);
	    reader->rngSchemas = NULL;
	    return(-1);
	}
    } else {
	/* Use the given validation context. */
	reader->rngValidCtxt = ctxt;
	reader->rngPreserveCtxt = 1;
    }
    /*
    * Redirect the validation context's error channels to use
    * the reader channels.
    * TODO: In case the user provides the validation context we
    *	could make this redirection optional.
    */
    if ((reader->errorFunc != NULL) || (reader->sErrorFunc != NULL))
        xmlRelaxNGSetValidStructuredErrors(reader->rngValidCtxt,
                xmlTextReaderStructuredRelay, reader);
    reader->rngValidErrors = 0;
    reader->rngFullNode = NULL;
    reader->validate = XML_TEXTREADER_VALIDATE_RNG;
    return(0);
}